

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CumSumLayerParams::CumSumLayerParams
          (CumSumLayerParams *this,CumSumLayerParams *from)

{
  CumSumLayerParams *from_local;
  CumSumLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CumSumLayerParams_006f8258;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->axis_,&from->axis_,10);
  return;
}

Assistant:

CumSumLayerParams::CumSumLayerParams(const CumSumLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    static_cast<size_t>(reinterpret_cast<char*>(&reverse_) -
    reinterpret_cast<char*>(&axis_)) + sizeof(reverse_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CumSumLayerParams)
}